

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis.c
# Opt level: O2

char * snvis(char *mbdst,size_t dlen,wchar_t c,wchar_t flags,wchar_t nextc,char *mbextra)

{
  wchar_t wVar1;
  char *pcVar2;
  char cc [2];
  size_t dlen_local;
  char *mbdst_local;
  
  cc[0] = (char)c;
  cc[1] = (char)nextc;
  dlen_local = dlen;
  mbdst_local = mbdst;
  wVar1 = istrsenvisx(&mbdst_local,&dlen_local,cc,1,flags,mbextra,(wchar_t *)0x0);
  pcVar2 = (char *)0x0;
  if (L'\xffffffff' < wVar1) {
    pcVar2 = mbdst_local + (uint)wVar1;
  }
  return pcVar2;
}

Assistant:

char *
snvis(char *mbdst, size_t dlen, int c, int flags, int nextc, const char *mbextra)
{
	char cc[2];
	int ret;

	cc[0] = c;
	cc[1] = nextc;

	ret = istrsenvisx(&mbdst, &dlen, cc, 1, flags, mbextra, NULL);
	if (ret < 0)
		return NULL;
	return mbdst + ret;
}